

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgRuleWavelet.cpp
# Opt level: O0

double __thiscall TasGrid::RuleWavelet::eval_linear<0>(RuleWavelet *this,int point,double x)

{
  int iVar1;
  int iVar2;
  __type _Var3;
  double shift;
  double value;
  double scale;
  int subindex;
  int l;
  double x_local;
  int point_local;
  RuleWavelet *this_local;
  
  iVar1 = Maths::intlog2(point + -1);
  iVar2 = (point + -1) % (1 << ((byte)iVar1 & 0x1f));
  _Var3 = ::std::pow<int,int>(2,iVar1 + -2);
  if (iVar2 == 0) {
    shift = linear_boundary_wavelet<0>(this,_Var3 * (x + 1.0) + -1.0,x <= 0.0);
  }
  else if (iVar2 == (1 << ((byte)iVar1 & 0x1f)) + -1) {
    shift = linear_boundary_wavelet<0>(this,_Var3 * (1.0 - x) + -1.0,0.0 < x);
  }
  else {
    shift = linear_central_wavelet<0>
                      (this,(_Var3 * (x + 1.0) + -1.0) - (double)(iVar2 + -1) * 0.5,x <= 0.0);
  }
  return shift;
}

Assistant:

inline double RuleWavelet::eval_linear(int point, double x) const{
    // Given a wavelet designated by point and a value x, evaluates the wavelet (or its derivative) at x.
    // If x <= 0 (resp. x > 0), we take only right (resp. left) derivatives.

    // Standard Lifted Wavelets
    int l = Maths::intlog2(point - 1);
    int subindex = (point - 1) % (1 << l);
    double scale = std::pow(2,l-2);

    double value;
    if (subindex == 0){
        // Left boundary wavelet.
        value = linear_boundary_wavelet<mode>(scale * (x + 1.) - 1., x <= 0.0);
    } else if (subindex == (1 << l) - 1) {
        // Right boundary wavelet.
        value = linear_boundary_wavelet<mode>(scale * (1. - x) - 1., x > 0.0);
    } else {
        // Central wavelets
        double shift = 0.5 * (double (subindex - 1));
        value = linear_central_wavelet<mode>(scale * (x + 1) - 1. - shift, x <= 0.0);
    }
    // Adjust for the chain rule multiplier.
    if (mode == 1) value *= (subindex == (1 << l) - 1) ? -scale : scale;

    return value;
}